

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum32.c
# Opt level: O3

Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 * Hacl_Bignum32_mont_ctx_init(uint32_t len,uint32_t *n)

{
  uint32_t uVar1;
  uint32_t *res;
  uint32_t *__dest;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *pHVar2;
  uint uVar3;
  ulong __nmemb;
  ulong uVar4;
  
  __nmemb = (ulong)len;
  res = (uint32_t *)calloc(__nmemb,4);
  __dest = (uint32_t *)calloc(__nmemb,4);
  memcpy(__dest,n,__nmemb * 4);
  if (len == 0) {
    uVar1 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar1 = FStar_UInt32_eq_mask(n[uVar4],0);
      uVar3 = (uVar3 ^ (uint)uVar4) & uVar1 ^ (uint)uVar4;
      uVar4 = uVar4 + 1;
    } while (__nmemb != uVar4);
    uVar1 = uVar3 << 5;
  }
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u32(len,uVar1,n,res);
  uVar1 = Hacl_Bignum_ModInvLimb_mod_inv_uint32(*n);
  pHVar2 = (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *)malloc(0x20);
  pHVar2->len = len;
  pHVar2->n = __dest;
  pHVar2->mu = uVar1;
  pHVar2->r2 = res;
  return pHVar2;
}

Assistant:

Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32
*Hacl_Bignum32_mont_ctx_init(uint32_t len, uint32_t *n)
{
  KRML_CHECK_SIZE(sizeof (uint32_t), len);
  uint32_t *r2 = (uint32_t *)KRML_HOST_CALLOC(len, sizeof (uint32_t));
  KRML_CHECK_SIZE(sizeof (uint32_t), len);
  uint32_t *n1 = (uint32_t *)KRML_HOST_CALLOC(len, sizeof (uint32_t));
  uint32_t *r21 = r2;
  uint32_t *n11 = n1;
  memcpy(n11, n, len * sizeof (uint32_t));
  uint32_t nBits = 32U * Hacl_Bignum_Lib_bn_get_top_index_u32(len, n);
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u32(len, nBits, n, r21);
  uint32_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint32(n[0U]);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 res = { .len = len, .n = n11, .mu = mu, .r2 = r21 };
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32
  *buf =
    (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *)KRML_HOST_MALLOC(sizeof (
        Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32
      ));
  buf[0U] = res;
  return buf;
}